

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void phosg::clamp_blit_dimensions
               (Image *dest,Image *source,ssize_t *x,ssize_t *y,ssize_t *w,ssize_t *h,ssize_t *sx,
               ssize_t *sy)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ssize_t *h_local;
  ssize_t *w_local;
  ssize_t *y_local;
  ssize_t *x_local;
  Image *source_local;
  Image *dest_local;
  
  if (*sx < 0) {
    *x = *x - *sx;
    *w = *sx + *w;
    *sx = 0;
  }
  if (*sy < 0) {
    *y = *y - *sy;
    *h = *sy + *h;
    *sy = 0;
  }
  if (*x < 0) {
    *sx = *sx - *x;
    *w = *x + *w;
    *x = 0;
  }
  if (*y < 0) {
    *sy = *sy - *y;
    *h = *y + *h;
    *y = 0;
  }
  lVar1 = *sx;
  lVar2 = *w;
  sVar3 = Image::get_width(source);
  if ((long)sVar3 < lVar1 + lVar2) {
    sVar3 = Image::get_width(source);
    *w = sVar3 - *sx;
  }
  lVar1 = *sy;
  lVar2 = *h;
  sVar3 = Image::get_height(source);
  if ((long)sVar3 < lVar1 + lVar2) {
    sVar3 = Image::get_height(source);
    *h = sVar3 - *sy;
  }
  lVar1 = *x;
  lVar2 = *w;
  sVar3 = Image::get_width(dest);
  if ((long)sVar3 < lVar1 + lVar2) {
    sVar3 = Image::get_width(dest);
    *w = sVar3 - *x;
  }
  lVar1 = *y;
  lVar2 = *h;
  sVar3 = Image::get_height(dest);
  if ((long)sVar3 < lVar1 + lVar2) {
    sVar3 = Image::get_height(dest);
    *h = sVar3 - *y;
  }
  if ((*w < 0) || (*h < 0)) {
    *w = 0;
    *h = 0;
  }
  return;
}

Assistant:

static inline void clamp_blit_dimensions(
    const Image& dest, const Image& source, ssize_t* x, ssize_t* y, ssize_t* w,
    ssize_t* h, ssize_t* sx, ssize_t* sy) {
  // If the source coordinates are negative, trim off the left/top
  if (*sx < 0) {
    *x -= *sx;
    *w += *sx;
    *sx = 0;
  }
  if (*sy < 0) {
    *y -= *sy;
    *h += *sy;
    *sy = 0;
  }
  // If the dest coordinates are negative, trim off the left/top
  if (*x < 0) {
    *sx -= *x;
    *w += *x;
    *x = 0;
  }
  if (*y < 0) {
    *sy -= *y;
    *h += *y;
    *y = 0;
  }
  // If the area extends beyond the source, trim off the right/bottom
  if (*sx + *w > static_cast<ssize_t>(source.get_width())) {
    *w = source.get_width() - *sx;
  }
  if (*sy + *h > static_cast<ssize_t>(source.get_height())) {
    *h = source.get_height() - *sy;
  }
  // If the area extends beyond the dest, trim off the right/bottom
  if (*x + *w > static_cast<ssize_t>(dest.get_width())) {
    *w = dest.get_width() - *x;
  }
  if (*y + *h > static_cast<ssize_t>(dest.get_height())) {
    *h = dest.get_height() - *y;
  }

  // If either width or height are negative, then the entire area is out of
  // bounds for either the source or dest - make the area empty
  if (*w < 0 || *h < 0) {
    *w = 0;
    *h = 0;
  }
}